

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_test.cpp
# Opt level: O2

bool test_type_conversion<std::reference_wrapper<double_const>>(Boxed_Value *bv,bool expectedpass)

{
  bool bVar1;
  ostream *poVar2;
  char *pcVar3;
  
  bVar1 = run_test_type_conversion<std::reference_wrapper<double_const>>(bv,expectedpass);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error with type conversion test. From: ");
    pcVar3 = "const ";
    if (((((bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         m_type_info).m_flags & 1) == 0) {
      pcVar3 = "";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    pcVar3 = chaiscript::Type_Info::name
                       (&((bv->m_data).
                          super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->m_type_info);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2," To: ");
    poVar2 = std::operator<<(poVar2,"");
    poVar2 = std::operator<<(poVar2,"St17reference_wrapperIKdE");
    poVar2 = std::operator<<(poVar2," test was expected to ");
    pcVar3 = "fail";
    if (expectedpass) {
      pcVar3 = "succeed";
    }
    poVar2 = std::operator<<(poVar2,pcVar3);
    std::operator<<(poVar2," but did not\n");
  }
  return bVar1;
}

Assistant:

bool test_type_conversion(const Boxed_Value &bv, bool expectedpass) {
  bool ret = run_test_type_conversion<To>(bv, expectedpass);

  if (!ret) {
    std::cerr << "Error with type conversion test. From: " << (bv.is_const() ? "const " : "")
              << bv.get_type_info().name() << " To: " << (std::is_const<To>::value ? "const " : "")
              << typeid(To).name() << " test was expected to " << (expectedpass ? "succeed" : "fail")
              << " but did not\n";
  }

  return ret;
}